

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdExecuteCommands
          (CommandBuffer *this,
          vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
          *command_buffers)

{
  undefined8 uVar1;
  ulong uVar2;
  size_type sVar3;
  element_type *this_00;
  VkCommandBuffer pVVar4;
  reference ppVVar5;
  VkCommandBuffer_T **ppVVar6;
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  *in_RSI;
  long in_RDI;
  uint32_t i;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> handles;
  allocator_type *in_stack_ffffffffffffff90;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *this_01;
  size_type in_stack_ffffffffffffff98;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *in_stack_ffffffffffffffa0;
  uint local_40;
  allocator<VkCommandBuffer_T_*> local_29;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> local_28;
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  ::size(in_RSI);
  std::allocator<VkCommandBuffer_T_*>::allocator((allocator<VkCommandBuffer_T_*> *)0x2abf7f);
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<VkCommandBuffer_T_*>::~allocator(&local_29);
  local_40 = 0;
  while( true ) {
    uVar2 = (ulong)local_40;
    sVar3 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::size(&local_28);
    if (sVar3 <= uVar2) break;
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::operator[](local_10,(ulong)local_40);
    this_00 = std::
              __shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2abfe3);
    pVVar4 = GetHandle(this_00);
    ppVVar5 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::operator[]
                        (&local_28,(ulong)local_40);
    *ppVVar5 = pVVar4;
    local_40 = local_40 + 1;
  }
  uVar1 = *(undefined8 *)(in_RDI + 0x28);
  this_01 = (vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)
            vkCmdExecuteCommands;
  sVar3 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::size(&local_28);
  ppVVar6 = std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::data
                      ((vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *)0x2ac083
                      );
  (*(code *)this_01)(uVar1,sVar3 & 0xffffffff,ppVVar6);
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~vector(this_01);
  return;
}

Assistant:

void CommandBuffer::CmdExecuteCommands(const std::vector<Ptr<CommandBuffer>> &command_buffers) const {
	std::vector<VkCommandBuffer> handles(command_buffers.size());
	for (uint32_t i = 0; i < handles.size(); ++i)
		handles[i] = command_buffers[i]->GetHandle();
	vkCmdExecuteCommands(m_command_buffer, handles.size(), handles.data());
}